

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int xmlListRemoveLast(xmlListPtr l,void *data)

{
  xmlLinkPtr lk;
  int iVar1;
  
  iVar1 = 0;
  if (l != (xmlListPtr)0x0) {
    lk = xmlListLinkReverseSearch(l,data);
    if (lk != (xmlLinkPtr)0x0) {
      xmlLinkDeallocator(l,lk);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlListRemoveLast(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;

    if (l == NULL)
        return(0);
    /*Find the last instance of this data */
    lk = xmlListLinkReverseSearch(l, data);
    if (lk != NULL) {
	xmlLinkDeallocator(l, lk);
        return 1;
    }
    return 0;
}